

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  cmCTestBuildHandler *pcVar4;
  char *pcVar5;
  cmGlobalGenerator *pcVar6;
  char *pcVar7;
  string *psVar8;
  pointer ppcVar9;
  char *__s;
  cmake *this_00;
  ostream *poVar10;
  char *pcVar11;
  allocator<char> local_233;
  allocator<char> local_232;
  allocator<char> local_231;
  cmGlobalGenerator *local_230;
  string dir;
  string local_208;
  string buildCommand;
  string e;
  string local_50;
  
  pcVar4 = (cmCTestBuildHandler *)
           cmCTest::GetInitializedHandler
                     ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"build");
  if (pcVar4 == (cmCTestBuildHandler *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"internal CTest error. Cannot instantiate build handler",
               (allocator<char> *)&dir);
    cmCommand::SetError((cmCommand *)this,&e);
LAB_001a3b5b:
    std::__cxx11::string::~string((string *)&e);
LAB_001a3bb3:
    pcVar4 = (cmCTestBuildHandler *)0x0;
  }
  else {
    this->Handler = pcVar4;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_BUILD_COMMAND",(allocator<char> *)&dir);
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CTEST_CMAKE_GENERATOR",(allocator<char> *)&dir);
      pcVar6 = (cmGlobalGenerator *)cmMakefile::GetDefinition(pcVar1,&e);
      std::__cxx11::string::~string((string *)&e);
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"CTEST_BUILD_CONFIGURATION",(allocator<char> *)&dir);
      pcVar7 = cmMakefile::GetDefinition(pcVar1,&e);
      std::__cxx11::string::~string((string *)&e);
      ppcVar9 = (this->super_cmCTestHandlerCommand).Values.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar5 = ppcVar9[10];
      if (((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) &&
         ((pcVar7 == (char *)0x0 || (pcVar5 = pcVar7, *pcVar7 == '\0')))) {
        psVar8 = cmCTest::GetConfigType_abi_cxx11_
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        pcVar5 = (psVar8->_M_dataplus)._M_p;
        ppcVar9 = (this->super_cmCTestHandlerCommand).Values.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pcVar7 = ppcVar9[0xb];
      if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CTEST_BUILD_FLAGS",(allocator<char> *)&dir);
        pcVar7 = cmMakefile::GetDefinition(pcVar1,&e);
        std::__cxx11::string::~string((string *)&e);
        ppcVar9 = (this->super_cmCTestHandlerCommand).Values.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      __s = ppcVar9[9];
      if ((__s == (char *)0x0) || (*__s == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,"CTEST_BUILD_TARGET",(allocator<char> *)&dir);
        __s = cmMakefile::GetDefinition(pcVar1,&e);
        std::__cxx11::string::~string((string *)&e);
      }
      if ((pcVar6 == (cmGlobalGenerator *)0x0) ||
         (*(char *)&pcVar6->_vptr_cmGlobalGenerator == '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,
                        "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR is set. Otherwise, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                       );
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&dir);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        goto LAB_001a3bb3;
      }
      pcVar11 = "Release";
      if (pcVar5 != (char *)0x0) {
        pcVar11 = pcVar5;
      }
      local_230 = pcVar6;
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
LAB_001a3bc0:
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&e,(char *)local_230,(allocator<char> *)&dir);
        pcVar6 = cmake::CreateGlobalGenerator(this_00,&e);
        this->GlobalGenerator = pcVar6;
        std::__cxx11::string::~string((string *)&e);
        if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&e,"could not create generator named \"",(allocator<char> *)&dir);
          std::__cxx11::string::append((char *)&e);
          std::__cxx11::string::append((char *)&e);
          cmMakefile::IssueMessage
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile,FATAL_ERROR,&e);
          cmSystemTools::s_FatalErrorOccured = true;
          goto LAB_001a3b5b;
        }
      }
      else {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&e);
        bVar3 = std::operator!=(&e,(char *)local_230);
        std::__cxx11::string::~string((string *)&e);
        pcVar6 = this->GlobalGenerator;
        if (bVar3) {
          if (pcVar6 != (cmGlobalGenerator *)0x0) {
            (*pcVar6->_vptr_cmGlobalGenerator[1])();
          }
          this->GlobalGenerator = (cmGlobalGenerator *)0x0;
          goto LAB_001a3bc0;
        }
        if (pcVar6 == (cmGlobalGenerator *)0x0) goto LAB_001a3bc0;
      }
      pcVar5 = "Debug";
      if (*pcVar11 != '\0') {
        pcVar5 = pcVar11;
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&e,"BuildDirectory",(allocator<char> *)&buildCommand);
      cmCTest::GetCTestConfiguration(&dir,pcVar2,&e);
      std::__cxx11::string::~string((string *)&e);
      local_230 = this->GlobalGenerator;
      if (__s == (char *)0x0) {
        __s = "";
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&e,__s,&local_231);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,pcVar5,&local_232);
      pcVar5 = "";
      if (pcVar7 != (char *)0x0) {
        pcVar5 = pcVar7;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar5,&local_233);
      bVar3 = cmMakefile::IgnoreErrorsCMP0061
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmGlobalGenerator::GenerateCMakeBuildCommand
                (&buildCommand,local_230,&e,&local_208,&local_50,bVar3);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar10 = std::operator<<((ostream *)&e,"SetMakeCommand:");
      poVar10 = std::operator<<(poVar10,(string *)&buildCommand);
      std::operator<<(poVar10,"\n");
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                   ,0x7b,local_208._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
                 buildCommand._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&buildCommand);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar5
                 ,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_USE_LAUNCHERS",(allocator<char> *)&dir);
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar5 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
                 pcVar5,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"CTEST_LABELS_FOR_SUBPROJECTS",(allocator<char> *)&dir);
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar5 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                 "LabelsForSubprojects",pcVar5,(this->super_cmCTestHandlerCommand).Quiet);
    }
    (pcVar4->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &pcVar4->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler = this->CTest->GetInitializedHandler("build");
  if (!handler) {
    this->SetError("internal CTest error. Cannot instantiate build handler");
    return nullptr;
  }
  this->Handler = static_cast<cmCTestBuildHandler*>(handler);

  const char* ctestBuildCommand =
    this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if (ctestBuildCommand && *ctestBuildCommand) {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
                                       this->Quiet);
  } else {
    const char* cmakeGeneratorName =
      this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration =
      this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration =
      (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
           ? ctestBuildConfiguration
           : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags =
      (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget =
      (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if (cmakeGeneratorName && *cmakeGeneratorName) {
      if (!cmakeBuildConfiguration) {
        cmakeBuildConfiguration = "Release";
      }
      if (this->GlobalGenerator) {
        if (this->GlobalGenerator->GetName() != cmakeGeneratorName) {
          delete this->GlobalGenerator;
          this->GlobalGenerator = nullptr;
        }
      }
      if (!this->GlobalGenerator) {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if (!this->GlobalGenerator) {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return nullptr;
        }
      }
      if (strlen(cmakeBuildConfiguration) == 0) {
        const char* config = nullptr;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if (!config) {
          config = "Debug";
        }
        cmakeBuildConfiguration = config;
      }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand =
        this->GlobalGenerator->GenerateCMakeBuildCommand(
          cmakeBuildTarget ? cmakeBuildTarget : "", cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "SetMakeCommand:" << buildCommand << "\n",
                         this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
                                         this->Quiet);
    } else {
      std::ostringstream ostr;
      /* clang-format off */
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "is set. Otherwise, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      /* clang-format on */
      this->SetError(ostr.str());
      return nullptr;
    }
  }

  if (const char* useLaunchers =
        this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS")) {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
                                       this->Quiet);
  }

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}